

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_uint_span(basic_substring<const_char> *this)

{
  basic_substring<const_char> *in_RDI;
  basic_substring<const_char> *unaff_retaddr;
  size_t skip_start;
  basic_substring<const_char> ne;
  size_t in_stack_00000198;
  basic_substring<const_char> *in_stack_000001a0;
  undefined7 in_stack_ffffffffffffff78;
  basic_substring<const_char> local_60;
  basic_substring<const_char> local_48;
  basic_substring<const_char> *local_38;
  undefined8 local_20;
  char *local_10;
  size_t local_8;
  
  local_60 = first_non_empty_span(unaff_retaddr);
  local_38 = &local_60;
  local_48 = local_60;
  if (local_60.len != 0 && local_60.str != (char *)0x0) {
    if (*local_60.str == '-') {
      local_20 = 0;
      basic_substring(in_RDI,(char *)CONCAT17(1,in_stack_ffffffffffffff78),(size_t)in_RDI);
      local_48.len = local_8;
      local_48.str = local_10;
    }
    else {
      local_48 = _first_integral_span(in_stack_000001a0,in_stack_00000198);
    }
  }
  return local_48;
}

Assistant:

basic_substring first_uint_span() const
    {
        basic_substring ne = first_non_empty_span();
        if(ne.empty())
            return ne;
        if(ne.str[0] == '-')
            return first(0);
        size_t skip_start = (ne.str[0] == '+') ? 1 : 0;
        return ne._first_integral_span(skip_start);
    }